

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O0

int bssl::SSL_SESSION_parse_u16(CBS *cbs,uint16_t *out,CBS_ASN1_TAG tag,uint16_t default_value)

{
  int iVar1;
  ulong local_30;
  uint64_t value;
  uint16_t default_value_local;
  uint16_t *puStack_20;
  CBS_ASN1_TAG tag_local;
  uint16_t *out_local;
  CBS *cbs_local;
  
  value._2_2_ = default_value;
  value._4_4_ = tag;
  puStack_20 = out;
  out_local = (uint16_t *)cbs;
  iVar1 = CBS_get_optional_asn1_uint64(cbs,&local_30,tag,(ulong)default_value);
  if ((iVar1 == 0) || (0xffff < local_30)) {
    ERR_put_error(0x10,0,0xa0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                  ,0x1c5);
    cbs_local._4_4_ = 0;
  }
  else {
    *puStack_20 = (uint16_t)local_30;
    cbs_local._4_4_ = 1;
  }
  return cbs_local._4_4_;
}

Assistant:

static int SSL_SESSION_parse_u16(CBS *cbs, uint16_t *out, CBS_ASN1_TAG tag,
                                 uint16_t default_value) {
  uint64_t value;
  if (!CBS_get_optional_asn1_uint64(cbs, &value, tag,
                                    (uint64_t)default_value) ||
      value > 0xffff) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return 0;
  }
  *out = (uint16_t)value;
  return 1;
}